

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O0

vector<char16_t,_std::allocator<char16_t>_> * __thiscall
RandomTestData<char16_t,_std::vector<char16_t,_std::allocator<char16_t>_>_>::get_remainder
          (vector<char16_t,_std::allocator<char16_t>_> *__return_storage_ptr__,
          RandomTestData<char16_t,_std::vector<char16_t,_std::allocator<char16_t>_>_> *this,
          size_t in_times_split)

{
  size_t sVar1;
  size_type sVar2;
  ulong uVar3;
  iterator __first;
  iterator __last;
  __normal_iterator<char16_t_*,_std::vector<char16_t,_std::allocator<char16_t>_>_> local_78;
  const_iterator local_70;
  char16_t *local_68;
  char16_t *local_50;
  __normal_iterator<char16_t_*,_std::vector<char16_t,_std::allocator<char16_t>_>_> local_48;
  __normal_iterator<char16_t_*,_std::vector<char16_t,_std::allocator<char16_t>_>_> local_40;
  const_iterator local_38;
  reference local_30;
  value_type *token;
  size_t local_20;
  size_t in_times_split_local;
  RandomTestData<char16_t,_std::vector<char16_t,_std::allocator<char16_t>_>_> *this_local;
  vector<char16_t,_std::allocator<char16_t>_> *result;
  
  token._7_1_ = 0;
  local_20 = in_times_split;
  in_times_split_local = (size_t)this;
  this_local = (RandomTestData<char16_t,_std::vector<char16_t,_std::allocator<char16_t>_>_> *)
               __return_storage_ptr__;
  std::vector<char16_t,_std::allocator<char16_t>_>::vector(__return_storage_ptr__);
  while (sVar1 = local_20,
        sVar2 = std::
                vector<std::vector<char16_t,_std::allocator<char16_t>_>,_std::allocator<std::vector<char16_t,_std::allocator<char16_t>_>_>_>
                ::size(&this->m_tokens), sVar1 < sVar2) {
    local_30 = std::
               vector<std::vector<char16_t,_std::allocator<char16_t>_>,_std::allocator<std::vector<char16_t,_std::allocator<char16_t>_>_>_>
               ::operator[](&this->m_tokens,local_20);
    local_40._M_current =
         (char16_t *)std::vector<char16_t,_std::allocator<char16_t>_>::end(__return_storage_ptr__);
    __gnu_cxx::__normal_iterator<char16_t_const*,std::vector<char16_t,std::allocator<char16_t>>>::
    __normal_iterator<char16_t*>
              ((__normal_iterator<char16_t_const*,std::vector<char16_t,std::allocator<char16_t>>> *)
               &local_38,&local_40);
    local_48._M_current =
         (char16_t *)std::vector<char16_t,_std::allocator<char16_t>_>::begin(local_30);
    local_50 = (char16_t *)std::vector<char16_t,_std::allocator<char16_t>_>::end(local_30);
    local_68 = (char16_t *)
               std::vector<char16_t,std::allocator<char16_t>>::
               insert<__gnu_cxx::__normal_iterator<char16_t*,std::vector<char16_t,std::allocator<char16_t>>>,void>
                         ((vector<char16_t,std::allocator<char16_t>> *)__return_storage_ptr__,
                          local_38,local_48,
                          (__normal_iterator<char16_t_*,_std::vector<char16_t,_std::allocator<char16_t>_>_>
                           )local_50);
    uVar3 = local_20 + 1;
    local_20 = uVar3;
    sVar2 = std::
            vector<std::vector<char16_t,_std::allocator<char16_t>_>,_std::allocator<std::vector<char16_t,_std::allocator<char16_t>_>_>_>
            ::size(&this->m_tokens);
    if (uVar3 < sVar2) {
      local_78._M_current =
           (char16_t *)std::vector<char16_t,_std::allocator<char16_t>_>::end(__return_storage_ptr__)
      ;
      __gnu_cxx::__normal_iterator<char16_t_const*,std::vector<char16_t,std::allocator<char16_t>>>::
      __normal_iterator<char16_t*>
                ((__normal_iterator<char16_t_const*,std::vector<char16_t,std::allocator<char16_t>>>
                  *)&local_70,&local_78);
      __first = std::vector<char16_t,_std::allocator<char16_t>_>::begin(&this->m_delim);
      __last = std::vector<char16_t,_std::allocator<char16_t>_>::end(&this->m_delim);
      std::vector<char16_t,std::allocator<char16_t>>::
      insert<__gnu_cxx::__normal_iterator<char16_t*,std::vector<char16_t,std::allocator<char16_t>>>,void>
                ((vector<char16_t,std::allocator<char16_t>> *)__return_storage_ptr__,local_70,
                 (__normal_iterator<char16_t_*,_std::vector<char16_t,_std::allocator<char16_t>_>_>)
                 __first._M_current,
                 (__normal_iterator<char16_t_*,_std::vector<char16_t,_std::allocator<char16_t>_>_>)
                 __last._M_current);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

StringT get_remainder(size_t in_times_split) {
		StringT result;
		while (in_times_split < m_tokens.size()) {
			auto& token = m_tokens[in_times_split];
			result.insert(result.end(), token.begin(), token.end());
			++in_times_split;
			if (in_times_split < m_tokens.size()) {
				result.insert(result.end(), m_delim.begin(), m_delim.end());
			}
		}

		return result;
	}